

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packet.cpp
# Opt level: O2

string * __thiscall
PacketProcessor::Encode(string *__return_storage_ptr__,PacketProcessor *this,string *rawstr)

{
  char *pcVar1;
  pointer pcVar2;
  int i;
  long lVar3;
  long lVar4;
  ulong uVar5;
  char cVar6;
  string str;
  
  if ((this->emulti_e == '\0') ||
     ((pcVar2 = (rawstr->_M_dataplus)._M_p, pcVar2[2] == -1 && (pcVar2[3] == -1)))) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)rawstr);
  }
  else {
    DickWinderE(&str,this,rawstr);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    std::__cxx11::string::resize((ulong)__return_storage_ptr__);
    *(__return_storage_ptr__->_M_dataplus)._M_p = *str._M_dataplus._M_p;
    (__return_storage_ptr__->_M_dataplus)._M_p[1] = str._M_dataplus._M_p[1];
    lVar3 = 2;
    for (lVar4 = lVar3; lVar4 < (int)(uint)str._M_string_length; lVar4 = lVar4 + 2) {
      pcVar1 = str._M_dataplus._M_p + lVar3;
      lVar3 = lVar3 + 1;
      (__return_storage_ptr__->_M_dataplus)._M_p[lVar4] = *pcVar1 + -0x80;
    }
    for (uVar5 = (ulong)((~(uint)str._M_string_length | 0xfffffffe) + (uint)str._M_string_length);
        1 < (int)uVar5; uVar5 = uVar5 - 2) {
      pcVar1 = str._M_dataplus._M_p + lVar3;
      lVar3 = lVar3 + 1;
      (__return_storage_ptr__->_M_dataplus)._M_p[uVar5] = *pcVar1 + -0x80;
    }
    for (lVar3 = 2; lVar3 < (int)(uint)str._M_string_length; lVar3 = lVar3 + 1) {
      pcVar2 = (__return_storage_ptr__->_M_dataplus)._M_p;
      cVar6 = pcVar2[lVar3];
      if (cVar6 == -0x80) {
        cVar6 = '\0';
LAB_001664b4:
        pcVar2[lVar3] = cVar6;
      }
      else if (cVar6 == '\0') {
        cVar6 = -0x80;
        goto LAB_001664b4;
      }
    }
    std::__cxx11::string::~string((string *)&str);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string PacketProcessor::Encode(const std::string &rawstr)
{
	if (emulti_e == 0 || ((unsigned char)rawstr[2] == PACKET_A_INIT && (unsigned char)rawstr[3] == PACKET_F_INIT))
		return rawstr;

	std::string str = this->DickWinderE(rawstr);
	std::string newstr;
	int length = str.length();
	int i = 2;
	int ii = 2;

	newstr.resize(length);

	newstr[0] = str[0];
	newstr[1] = str[1];

	while (i < length)
	{
		newstr[i] = (unsigned char)str[ii++] ^ 0x80;
		i += 2;
	}

	i = length - 1;

	if (length % 2)
	{
		--i;
	}

	while (i >= 2)
	{
		newstr[i] = (unsigned char)str[ii++] ^ 0x80;
		i -= 2;
	}

	for (int i = 2; i < length; ++i)
	{
		if (static_cast<unsigned char>(newstr[i]) == 128)
		{
			newstr[i] = 0;
		}
		else if (newstr[i] == 0)
		{
			newstr[i] = 128;
		}
	}

	return newstr;
}